

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O1

int dfs_dinic(int v,int t,int flow)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  iVar5 = 0;
  if ((flow != 0) && (iVar3 = 0, iVar5 = flow, v != t)) {
    lVar8 = (long)v;
    iVar6 = *(int *)((anonymous_namespace)::ptr + lVar8 * 4);
    lVar7 = *(long *)((anonymous_namespace)::edges_dup + lVar8 * 0x18);
    iVar5 = 0;
    if (iVar6 < (int)((ulong)(*(long *)((anonymous_namespace)::edges_dup + 8 + lVar8 * 0x18) - lVar7
                             ) >> 2)) {
      do {
        uVar2 = *(uint *)(lVar7 + (long)iVar6 * 4);
        lVar7 = (long)(int)uVar2 * 0x10;
        iVar5 = *(int *)((anonymous_namespace)::edgelist + 4 + lVar7);
        if (*(int *)((anonymous_namespace)::dis + (long)iVar5 * 4) ==
            *(int *)((anonymous_namespace)::dis + lVar8 * 4) + 1) {
          iVar6 = *(int *)((anonymous_namespace)::edgelist + lVar7 + 8) -
                  *(int *)((anonymous_namespace)::edgelist + lVar7 + 0xc);
          if (flow <= iVar6) {
            iVar6 = flow;
          }
          iVar5 = dfs_dinic(iVar5,t,iVar6);
          lVar4 = (anonymous_namespace)::edgelist;
          bVar9 = iVar5 != 0;
          if (bVar9) {
            piVar1 = (int *)((anonymous_namespace)::edgelist + 0xc + lVar7);
            *piVar1 = *piVar1 + iVar5;
            piVar1 = (int *)(lVar4 + 0xc + (long)(int)(uVar2 ^ 1) * 0x10);
            *piVar1 = *piVar1 - iVar5;
            iVar3 = iVar5;
          }
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          return iVar3;
        }
        iVar6 = *(int *)((anonymous_namespace)::ptr + lVar8 * 4) + 1;
        *(int *)((anonymous_namespace)::ptr + lVar8 * 4) = iVar6;
        lVar7 = *(long *)((anonymous_namespace)::edges_dup + lVar8 * 0x18);
      } while (iVar6 < (int)((ulong)(*(long *)((anonymous_namespace)::edges_dup + 8 + lVar8 * 0x18)
                                    - lVar7) >> 2));
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int dfs_dinic(int v, int t, int flow) {
    if (!flow) {
        return 0;
    }
    
    if (v == t) {
        return flow;
    }
    
    for (; ptr[v] < (int) edges_dup[v].size(); ptr[v]++) {
        int ind = edges_dup[v][ptr[v]];
        int next = edgelist[ind].b;
        
        if (dis[next] != dis[v] + 1) {
            continue;
        }
        
        int pushed = dfs_dinic(next, t, min(flow, edgelist[ind].c - edgelist[ind].flow));
        
        if (pushed) {
            edgelist[ind].flow += pushed;
            edgelist[ind ^ 1].flow -= pushed;
            return pushed;
        }
    }
    
    return 0;
}